

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void biffob(bifcxdef *ctx,int argc)

{
  runcxdef *prVar1;
  voccxdef *voc;
  runsdef *prVar2;
  vocidef **ppvVar3;
  vocidef *v;
  int iVar4;
  int iVar5;
  objnum cls;
  short sVar6;
  vocidef ***pppvVar7;
  long lVar8;
  
  prVar1 = ctx->bifcxrun;
  voc = prVar1->runcxvoc;
  cls = 0xffff;
  if (argc != 0) {
    if (argc != 1) {
      prVar1->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x401);
    }
    prVar2 = prVar1->runcxsp;
    prVar1->runcxsp = prVar2 + -1;
    if (prVar2[-1].runstyp != '\x02') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3f2);
    }
    cls = (ctx->bifcxrun->runcxsp->runsv).runsvobj;
  }
  pppvVar7 = voc->voccxinh;
  sVar6 = 0;
  iVar5 = 0;
  do {
    ppvVar3 = *pppvVar7;
    if (ppvVar3 != (vocidef **)0x0) {
      lVar8 = 0;
      do {
        v = ppvVar3[lVar8];
        if ((v != (vocidef *)0x0) && (((v->vociu).vocius.vociusflg & 1) == 0)) {
          if (cls == 0xffff) {
LAB_00211cfe:
            runpobj(ctx->bifcxrun,(short)lVar8 - sVar6);
            return;
          }
          iVar4 = bifinh(voc,v,cls);
          if (iVar4 != 0) goto LAB_00211cfe;
        }
        lVar8 = lVar8 + 1;
      } while ((int)lVar8 != 0x100);
    }
    pppvVar7 = pppvVar7 + 1;
    iVar5 = iVar5 + 1;
    sVar6 = sVar6 + -0x100;
    if (iVar5 == 0x80) {
      runpnil(ctx->bifcxrun);
      return;
    }
  } while( true );
}

Assistant:

void biffob(bifcxdef *ctx, int argc)
{
    vocidef ***vpg;
    vocidef  **v;
    objnum     obj;
    int        i;
    int        j;
    objnum     cls;
    voccxdef  *voc = ctx->bifcxrun->runcxvoc;

    /* get class to search for, if one is specified */
    if (argc == 0)
        cls = MCMONINV;
    else if (argc == 1)
        cls = runpopobj(ctx->bifcxrun);
    else
        runsig(ctx->bifcxrun, ERR_BIFARGC);
    
    for (vpg = voc->voccxinh, i = 0 ; i < VOCINHMAX ; ++vpg, ++i)
    {
        if (!*vpg) continue;
        for (v = *vpg, obj = (i << 8), j = 0 ; j < 256 ; ++v, ++obj, ++j)
        {
            if (!*v || ((*v)->vociflg & VOCIFCLASS)
                || (cls != MCMONINV && !bifinh(voc, *v, cls)))
                continue;
            
            /* this is an object we can use - push it */
            runpobj(ctx->bifcxrun, obj);
            return;
        }
    }
    
    /* no objects found at all - return nil */
    runpnil(ctx->bifcxrun);
}